

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

string * toCamelCase(string *__return_storage_ptr__,string *value,bool keepSeparatedNumbersSeparated
                    )

{
  size_type __res;
  pointer pcVar1;
  char __c;
  int iVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  
  __res = value->_M_string_length;
  if ((__res != 0) &&
     (iVar3 = (int)*(value->_M_dataplus)._M_p, iVar2 = isupper(iVar3),
     9 < iVar3 - 0x30U && iVar2 == 0)) {
    __assert_fail("value.empty() || isupper( value[0] ) || isdigit( value[0] )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                  ,0x1bb,"std::string toCamelCase(const std::string &, bool)");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  uVar4 = 0;
  do {
    if (value->_M_string_length <= uVar4) {
      return __return_storage_ptr__;
    }
    pcVar1 = (value->_M_dataplus)._M_p;
    __c = pcVar1[uVar4];
    if (__c == 0x5f) {
      if ((((uVar4 != 0 && keepSeparatedNumbersSeparated) && (uVar4 < value->_M_string_length - 1))
          && ((int)pcVar1[uVar4 - 1] - 0x30U < 10)) &&
         (__c = '_', (int)pcVar1[uVar4 + 1] - 0x30U < 10)) goto LAB_00111cc9;
    }
    else {
      if ((uVar4 != 0) && (9 < (int)pcVar1[uVar4 - 1] - 0x30U && pcVar1[uVar4 - 1] != '_')) {
        iVar2 = tolower((int)__c);
        __c = (char)iVar2;
      }
LAB_00111cc9:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

inline std::string toCamelCase( std::string const & value, bool keepSeparatedNumbersSeparated )
{
  assert( value.empty() || isupper( value[0] ) || isdigit( value[0] ) );
  std::string result;
  result.reserve( value.size() );
  for ( size_t i = 0; i < value.size(); ++i )
  {
    if ( value[i] == '_' )
    {
      if ( keepSeparatedNumbersSeparated && ( 0 < i ) && isdigit( value[i - 1] ) && ( i < value.size() - 1 ) && isdigit( value[i + 1] ) )
      {
        result.push_back( '_' );
      }
    }
    else
    {
      result.push_back( ( ( 0 == i ) || ( value[i - 1] == '_' ) || isdigit( value[i - 1] ) ) ? value[i] : static_cast<char>( tolower( value[i] ) ) );
    }
  }
  return result;
}